

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Printer *printer_00;
  Context *context;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar2;
  OneofDescriptor *pOVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  JavaType type;
  char *pcVar8;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar9;
  MessageOptions *this_00;
  Options *pOVar10;
  EnumDescriptor *descriptor;
  Descriptor *pDVar11;
  FieldDescriptor *pFVar12;
  ImmutableFieldLiteGenerator *pIVar13;
  OneofGeneratorInfo *pOVar14;
  FileDescriptor *descriptor_00;
  int index;
  int __c;
  Descriptor *descriptor_01;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FieldDescriptor *field_00;
  AlphaNum *a_02;
  string *__s;
  undefined1 kdoc;
  hasher *phVar15;
  Arg *a0;
  iterator iVar16;
  string_view sVar17;
  undefined1 auVar18 [16];
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c08;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a90;
  string_view local_a78;
  ImmutableExtensionLiteGenerator local_a68;
  int local_a24;
  undefined1 auStack_a20 [4];
  int i_5;
  char *local_a18;
  string local_a10;
  string_view local_9f0;
  string local_9e0;
  string_view local_9c0;
  string_view local_9b0;
  string_view local_9a0;
  string local_990;
  string_view local_970;
  string_view local_960;
  string_view local_950;
  string_view local_940;
  string_view local_930;
  string_view local_920;
  string_view local_910;
  string local_900;
  string_view local_8e0;
  string_view local_8d0;
  string_view local_8c0;
  string local_8b0;
  string_view local_890;
  string_view local_880;
  string_view local_870;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_858;
  string_view local_850;
  AlphaNum local_840;
  string local_810;
  string local_7f0;
  string_view local_7d0;
  int local_7c0;
  int i_4;
  string_view local_7b0;
  string_view local_7a0;
  string_view local_790;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_778;
  string_view local_770;
  string_view local_760;
  string_view local_750;
  string_view local_740;
  undefined1 local_730 [16];
  string local_720;
  string_view local_700;
  string_view local_6f0;
  string local_6e0;
  AlphaNum local_6c0;
  string local_690;
  string_view local_670;
  FieldDescriptor *local_660;
  FieldDescriptor *field_1;
  undefined1 auStack_650 [4];
  int j_1;
  string_view local_640;
  string_view local_630;
  string_view local_620;
  undefined1 local_610 [16];
  string local_600;
  string_view local_5e0;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_5c8;
  string_view local_5c0;
  AlphaNum local_5b0;
  string local_580;
  string_view local_560;
  string local_550;
  string_view local_530;
  FieldDescriptor *local_520;
  FieldDescriptor *field;
  int j;
  string_view local_508;
  string_view local_4f8;
  string_view local_4e8;
  string_view local_4d8;
  AlphaNum local_4c8;
  string local_498;
  OneofDescriptor *local_478;
  OneofDescriptor *oneof;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv;
  int local_460;
  undefined1 local_458 [8];
  iterator __end3;
  undefined1 local_438 [8];
  iterator __begin3;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range3;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_418;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  undefined1 local_3b0 [24];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string_view local_360;
  uint local_350;
  int local_34c;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  ImmutableMessageLiteGenerator messageGenerator;
  undefined1 local_2e0 [4];
  int i_1;
  int local_288;
  int i;
  string_view local_278;
  string_view local_268;
  string_view local_258;
  string local_248;
  Arg local_228;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  string local_1e8;
  string_view local_1c8;
  string local_1b8 [8];
  string builder_type;
  undefined1 local_190 [32];
  undefined1 local_170 [80];
  string local_120;
  allocator<char> local_f9;
  string_view local_f8;
  string local_e8 [33];
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c7;
  key_equal local_c6;
  hasher local_c5 [13];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_50 [24];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_own_file;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  variables.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0xf] =
       IsOwnFile<google::protobuf::Descriptor>((this->super_MessageGenerator).descriptor_,true);
  local_b8 = &local_b0;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            (local_b8,(char (*) [2])0x1e6fede,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  local_b8 = &local_80;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            (local_b8,(char (*) [2])0x1e7e13f,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  local_50._0_8_ = &local_b0;
  local_50._8_8_ = (char *)0x2;
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_c7);
  iVar2._M_len = local_50._8_8_;
  iVar2._M_array = (iterator)local_50._0_8_;
  phVar15 = local_c5;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_50 + 0x10),iVar2,0,phVar15,&local_c6,&local_c7);
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_c7);
  local_a90 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_50;
  do {
    local_a90 = local_a90 + -1;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_a90);
    kdoc = SUB81(phVar15,0);
  } while (local_a90 != &local_b0);
  pcVar8 = " static ";
  if ((variables.
       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .
       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       .settings_.
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
       .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
       heap_or_soo_.soo_data[0xf] & 1) != 0) {
    pcVar8 = " ";
  }
  pbVar9 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(local_50 + 0x10),(key_arg<char[7]> *)"static");
  std::__cxx11::string::operator=((string *)pbVar9,pcVar8);
  local_f8 = Descriptor::name((this->super_MessageGenerator).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_e8,&local_f8,&local_f9);
  pbVar9 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(local_50 + 0x10),(key_arg<char[10]> *)0x1fb9081);
  std::__cxx11::string::operator=((string *)pbVar9,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_f9);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)(local_170 + 0x50),(java *)(this->super_MessageGenerator).descriptor_,
             descriptor_01);
  pbVar9 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(local_50 + 0x10),(key_arg<char[17]> *)"extra_interfaces");
  std::__cxx11::string::operator=((string *)pbVar9,(string *)(local_170 + 0x50));
  std::__cxx11::string::~string((string *)(local_170 + 0x50));
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar4 = MessageOptions::deprecated(this_00);
  pcVar8 = anon_var_dwarf_37cdd0 + 5;
  if (bVar4) {
    pcVar8 = "@java.lang.Deprecated ";
  }
  pbVar9 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)(local_50 + 0x10),(key_arg<char[12]> *)"deprecation");
  std::__cxx11::string::operator=((string *)pbVar9,pcVar8);
  printer_00 = (Printer *)(this->super_MessageGenerator).descriptor_;
  pOVar10 = Context::options(this->context_);
  Options::Options((Options *)local_170,pOVar10);
  WriteMessageDocComment
            ((java *)printer,printer_00,(Descriptor *)local_170,(Options *)0x0,(bool)kdoc);
  Options::~Options((Options *)local_170);
  pDVar11 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,anon_var_dwarf_37cdd0 + 5,
             (allocator<char> *)(builder_type.field_2._M_local_buf + 0xf));
  a0 = (Arg *)local_190;
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar11,true,(string *)a0);
  std::__cxx11::string::~string((string *)local_190);
  std::allocator<char>::~allocator((allocator<char> *)(builder_type.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_1b8);
  iVar5 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (iVar5 < 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_258,
               "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_50 + 0x10),local_258);
    std::__cxx11::string::operator=(local_1b8,"com.google.protobuf.GeneratedMessageLite.Builder");
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1c8,
               "$deprecation$public $static$final class ${$$classname$$}$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_50 + 0x10),local_1c8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f8,"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>");
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_248,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_228,&local_248);
    sVar17._M_str = (char *)&local_228;
    sVar17._M_len = (size_t)local_1f8._M_str;
    absl::lts_20250127::Substitute_abi_cxx11_(&local_1e8,(lts_20250127 *)local_1f8._M_len,sVar17,a0)
    ;
    std::__cxx11::string::operator=(local_1b8,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_248);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_278,"}");
  pDVar11 = (this->super_MessageGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&i);
  protobuf::io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,local_268,local_278,pDVar11,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)_i);
  protobuf::io::Printer::Indent(printer);
  GenerateConstructor(this,printer);
  local_288 = 0;
  while( true ) {
    iVar5 = local_288;
    iVar6 = Descriptor::enum_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar6 <= iVar5) break;
    descriptor = Descriptor::enum_type((this->super_MessageGenerator).descriptor_,local_288);
    EnumLiteGenerator::EnumLiteGenerator
              ((EnumLiteGenerator *)local_2e0,descriptor,true,this->context_);
    EnumLiteGenerator::Generate((EnumLiteGenerator *)local_2e0,printer);
    EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_2e0);
    local_288 = local_288 + 1;
  }
  messageGenerator.field_generators_.field_generators_.
  super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar5 = messageGenerator.field_generators_.field_generators_.
            super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    iVar6 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar6 <= iVar5) break;
    pDVar11 = Descriptor::nested_type
                        ((this->super_MessageGenerator).descriptor_,
                         messageGenerator.field_generators_.field_generators_.
                         super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    bVar4 = IsMapEntry(pDVar11);
    if (!bVar4) {
      pDVar11 = Descriptor::nested_type
                          ((this->super_MessageGenerator).descriptor_,
                           messageGenerator.field_generators_.field_generators_.
                           super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)&i_2,pDVar11,this->context_);
      GenerateInterface((ImmutableMessageLiteGenerator *)&i_2,printer);
      Generate((ImmutableMessageLiteGenerator *)&i_2,printer);
      ~ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)&i_2);
    }
    messageGenerator.field_generators_.field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         messageGenerator.field_generators_.field_generators_.
         super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  totalInts = 0;
  i_3 = 0;
  while( true ) {
    iVar5 = i_3;
    iVar6 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar6 <= iVar5) break;
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_3);
    pIVar13 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                        (&this->field_generators_,pFVar12);
    iVar5 = (*(pIVar13->super_FieldGenerator)._vptr_FieldGenerator[3])();
    totalInts = iVar5 + totalInts;
    i_3 = i_3 + 1;
  }
  local_34c = (totalInts + 0x1f) / 0x20;
  for (local_350 = 0; (int)local_350 < local_34c; local_350 = local_350 + 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_360,"private int $bit_field_name$;\n");
    GetBitFieldName_abi_cxx11_
              ((string *)
               ((long)&vars.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8),(java *)(ulong)local_350,index);
    protobuf::io::Printer::Print<char[15],std::__cxx11::string>
              (printer,local_360,(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&vars.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8));
    std::__cxx11::string::~string
              ((string *)
               (vars.
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.soo_data + 8));
  }
  local_418 = &local_410;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            (local_418,(char (*) [2])0x1e6fede,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  local_418 = &local_3e0;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[1],_true>
            (local_418,(char (*) [2])0x1e7e13f,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  local_3b0._0_8_ = &local_410;
  local_3b0._8_8_ = (char *)0x2;
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&__range3 + 5));
  iVar1._M_len = local_3b0._8_8_;
  iVar1._M_array = (iterator)local_3b0._0_8_;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_3b0 + 0x10),iVar1,0,(hasher *)((long)&__range3 + 7),
                 (key_equal *)((long)&__range3 + 6),
                 (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&__range3 + 5));
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&__range3 + 5));
  local_c08 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_3b0;
  do {
    local_c08 = local_c08 + -1;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_c08);
  } while (local_c08 != &local_410);
  __begin3._8_8_ = &(this->super_MessageGenerator).oneofs_;
  iVar16 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
           ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                    *)__begin3._8_8_);
  __end3._8_8_ = iVar16.node_;
  __begin3.node_._0_4_ = iVar16.position_;
  local_438 = (undefined1  [8])__end3._8_8_;
  iVar16 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
           ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                  *)__begin3._8_8_);
  kv = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar16.node_;
  local_460 = iVar16.position_;
  local_458 = (undefined1  [8])kv;
  __end3.node_._0_4_ = local_460;
  while( true ) {
    bVar4 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                          *)local_438,(iterator *)local_458);
    if (!bVar4) break;
    oneof = (OneofDescriptor *)
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
            ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                         *)local_438);
    local_478 = (OneofDescriptor *)(oneof->all_names_).payload_;
    pOVar14 = Context::GetOneofGeneratorInfo(this->context_,local_478);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)(local_3b0 + 0x10),(key_arg<char[11]> *)0x1f94809);
    std::__cxx11::string::operator=((string *)pbVar9,(string *)pOVar14);
    pOVar14 = Context::GetOneofGeneratorInfo(this->context_,local_478);
    __s = &pOVar14->capitalized_name;
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)(local_3b0 + 0x10),(key_arg<char[23]> *)"oneof_capitalized_name");
    std::__cxx11::string::operator=((string *)pbVar9,(string *)__s);
    pcVar8 = OneofDescriptor::index(local_478,(char *)__s,__c);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_4c8,(int)pcVar8);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_498,(lts_20250127 *)&local_4c8,a);
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)(local_3b0 + 0x10),(key_arg<char[12]> *)"oneof_index");
    std::__cxx11::string::operator=((string *)pbVar9,(string *)&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    pOVar10 = Context::options(this->context_);
    if ((pOVar10->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4d8,
                 "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n");
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_3b0 + 0x10),local_4d8);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4e8,"public enum ${$$oneof_capitalized_name$Case$}$ {\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_3b0 + 0x10),local_4e8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4f8,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_508,"}");
    pOVar3 = local_478;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&j);
    protobuf::io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,local_4f8,local_508,pOVar3,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)_j);
    protobuf::io::Printer::Indent(printer);
    field._0_4_ = 0;
    while( true ) {
      iVar5 = (int)field;
      uVar7 = OneofDescriptor::field_count(local_478);
      pcVar8 = (char *)(ulong)uVar7;
      if ((int)uVar7 <= iVar5) break;
      local_520 = OneofDescriptor::field(local_478,(int)field);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_530,"$field_name$($field_number$),\n");
      sVar17 = FieldDescriptor::name(local_520);
      s._M_len = sVar17._M_str;
      s._M_str = (char *)sVar17._M_len;
      local_560 = sVar17;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_550,(lts_20250127 *)sVar17._M_len,s);
      iVar5 = FieldDescriptor::number(local_520);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_5b0,iVar5);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_580,(lts_20250127 *)&local_5b0,a_00);
      protobuf::io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,local_530,(char (*) [11])0x1fe6a88,&local_550,(char (*) [13])0x1f881b7,
                 &local_580);
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string((string *)&local_550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_5c0,"field_name");
      pFVar12 = local_520;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
                ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_5c8);
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,local_5c0,pFVar12,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_5c8);
      field._0_4_ = (int)field + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_5e0,"$cap_oneof_name$_NOT_SET(0);\n");
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)(local_3b0 + 0x10),(key_arg<char[11]> *)0x1f94809);
    auVar18 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar9);
    s_00._M_len = auVar18._8_8_;
    s_00._M_str = pcVar8;
    local_610 = auVar18;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_600,auVar18._0_8_,s_00);
    protobuf::io::Printer::Print<char[15],std::__cxx11::string>
              (printer,local_5e0,(char (*) [15])"cap_oneof_name",&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_620,
               "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_3b0 + 0x10),local_620);
    pOVar10 = Context::options(this->context_);
    if ((pOVar10->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_630,
                 "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_3b0 + 0x10),local_630);
    }
    pOVar10 = Context::options(this->context_);
    if ((pOVar10->opensource_runtime & 1U) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_640,"@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
      protobuf::io::Printer::Print<>(printer,local_640);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_650,
               "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_3b0 + 0x10),_auStack_650);
    field_1._4_4_ = 0;
    while( true ) {
      iVar5 = field_1._4_4_;
      uVar7 = OneofDescriptor::field_count(local_478);
      pcVar8 = (char *)(ulong)uVar7;
      if ((int)uVar7 <= iVar5) break;
      local_660 = OneofDescriptor::field(local_478,field_1._4_4_);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_670,"    case $field_number$: return $field_name$;\n");
      iVar5 = FieldDescriptor::number(local_660);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_6c0,iVar5);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_690,(lts_20250127 *)&local_6c0,a_01);
      sVar17 = FieldDescriptor::name(local_660);
      s_01._M_len = sVar17._M_str;
      s_01._M_str = (char *)sVar17._M_len;
      local_6f0 = sVar17;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_6e0,(lts_20250127 *)sVar17._M_len,s_01);
      protobuf::io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,local_670,(char (*) [13])0x1f881b7,&local_690,(char (*) [11])0x1fe6a88,
                 &local_6e0);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_690);
      field_1._4_4_ = field_1._4_4_ + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_700,
               "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
              );
    pbVar9 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)(local_3b0 + 0x10),(key_arg<char[11]> *)0x1f94809);
    auVar18 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar9);
    s_02._M_len = auVar18._8_8_;
    s_02._M_str = pcVar8;
    local_730 = auVar18;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_720,auVar18._0_8_,s_02);
    protobuf::io::Printer::Print<char[15],std::__cxx11::string>
              (printer,local_700,(char (*) [15])"cap_oneof_name",&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    protobuf::io::Printer::Outdent(printer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_740,"};\n\n");
    protobuf::io::Printer::Print<>(printer,local_740);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_750,
               "@java.lang.Override\npublic $oneof_capitalized_name$Case\n${$get$oneof_capitalized_name$Case$}$() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_3b0 + 0x10),local_750);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_760,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_770,"}");
    pOVar3 = local_478;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_778);
    protobuf::io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,local_760,local_770,pOVar3,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_778);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_790,
               "\nprivate void ${$clear$oneof_capitalized_name$$}$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_3b0 + 0x10),local_790);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7a0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7b0,"}");
    pOVar3 = local_478;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&i_4);
    protobuf::io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,local_7a0,local_7b0,pOVar3,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)_i_4);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  *)local_438);
  }
  local_7c0 = 0;
  while( true ) {
    iVar5 = local_7c0;
    iVar6 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar6 <= iVar5) break;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_7d0,"public static final int $constant_name$ = $number$;\n");
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_7c0);
    FieldConstantName_abi_cxx11_(&local_7f0,(java *)pFVar12,field_00);
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_7c0);
    iVar5 = FieldDescriptor::number(pFVar12);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_840,iVar5);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_810,(lts_20250127 *)&local_840,a_02);
    protobuf::io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,local_7d0,(char (*) [14])0x1fdc80a,&local_7f0,(char (*) [7])0x1ddb344,
               &local_810);
    std::__cxx11::string::~string((string *)&local_810);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_850,"constant_name");
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_7c0);
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_858);
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,local_850,pFVar12,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_858);
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_7c0);
    pIVar13 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                        (&this->field_generators_,pFVar12);
    (*(pIVar13->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar13,printer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_870,"\n");
    protobuf::io::Printer::Print<>(printer,local_870);
    local_7c0 = local_7c0 + 1;
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar4 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_880,"private byte memoizedIsInitialized = 2;\n");
    protobuf::io::Printer::Print<>(printer,local_880);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_890,
             "@java.lang.Override\n@java.lang.SuppressWarnings({\"ThrowNull\"})\nprotected final java.lang.Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    java.lang.Object arg0, java.lang.Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_8b0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_890,(char (*) [10])0x1fb9081,&local_8b0);
  std::__cxx11::string::~string((string *)&local_8b0);
  protobuf::io::Printer::Indent(printer);
  protobuf::io::Printer::Indent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8c0,"case NEW_BUILDER: {\n");
  protobuf::io::Printer::Print<>(printer,local_8c0);
  protobuf::io::Printer::Indent(printer);
  GenerateDynamicMethodNewBuilder(this,printer);
  protobuf::io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8d0,"}\ncase BUILD_MESSAGE_INFO: {\n");
  protobuf::io::Printer::Print<>(printer,local_8d0);
  protobuf::io::Printer::Indent(printer);
  GenerateDynamicMethodNewBuildMessageInfo(this,printer);
  protobuf::io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8e0,
             "}\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  com.google.protobuf.Parser<$classname$> parser = PARSER;\n  if (parser == null) {\n    synchronized ($classname$.class) {\n      parser = PARSER;\n      if (parser == null) {\n        parser =\n            new DefaultInstanceBasedParser<$classname$>(\n                DEFAULT_INSTANCE);\n        PARSER = parser;\n      }\n    }\n  }\n  return parser;\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_900,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_8e0,(char (*) [10])0x1fb9081,&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  bVar4 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_910,
               "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return memoizedIsInitialized;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n  return null;\n}\n"
              );
    protobuf::io::Printer::Print<>(printer,local_910);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_920,
               "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return (byte) 1;\n}\n// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n// So it can do anything. Combine with default case for smaller codegen.\ncase SET_MEMOIZED_IS_INITIALIZED:\n"
              );
    protobuf::io::Printer::Print<>(printer,local_920);
  }
  protobuf::io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_930,
             "}\n// Should never happen. Generates tight code to throw an exception.\nthrow null;\n"
            );
  protobuf::io::Printer::Print<>(printer,local_930);
  protobuf::io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_940,"}\n\n");
  protobuf::io::Printer::Print<>(printer,local_940);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_950,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n");
  local_960 = Descriptor::full_name((this->super_MessageGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,local_950,(char (*) [10])0x208afb9,&local_960);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_970,"private static final $classname$ DEFAULT_INSTANCE;\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_990,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_970,(char (*) [10])0x1fb9081,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9a0,
             "static {\n  $classname$ defaultInstance = new $classname$();\n  // New instances are implicitly immutable so no need to make\n  // immutable.\n  DEFAULT_INSTANCE = defaultInstance;\n  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n    $classname$.class, defaultInstance);\n}\n\n"
            );
  local_9b0 = Descriptor::name((this->super_MessageGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,local_9a0,(char (*) [10])0x1fb9081,&local_9b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9c0,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_9e0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  protobuf::io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_9c0,(char (*) [10])0x1fb9081,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  descriptor_00 = Descriptor::file((this->super_MessageGenerator).descriptor_);
  bVar4 = IsWrappersProtoFile(descriptor_00);
  if (bVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_9f0,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
              );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_a10,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    pFVar12 = Descriptor::field((this->super_MessageGenerator).descriptor_,0);
    type = GetJavaType(pFVar12);
    _auStack_a20 = PrimitiveTypeName(type);
    protobuf::io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
              (printer,local_9f0,(char (*) [10])0x1fb9081,&local_a10,(char (*) [11])0x2019e1d,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_a20);
    std::__cxx11::string::~string((string *)&local_a10);
  }
  GenerateParser(this,printer);
  local_a24 = 0;
  while( true ) {
    iVar5 = local_a24;
    iVar6 = Descriptor::extension_count((this->super_MessageGenerator).descriptor_);
    if (iVar6 <= iVar5) break;
    pFVar12 = Descriptor::extension((this->super_MessageGenerator).descriptor_,local_a24);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              (&local_a68,pFVar12,this->context_);
    ImmutableExtensionLiteGenerator::Generate(&local_a68,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator(&local_a68);
    local_a24 = local_a24 + 1;
  }
  protobuf::io::Printer::Outdent(printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a78,"}\n\n");
  protobuf::io::Printer::Print<>(printer,local_a78);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_3b0 + 0x10));
  std::__cxx11::string::~string(local_1b8);
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_50 + 0x10));
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  absl::flat_hash_map<absl::string_view, std::string> variables = {{"{", ""},
                                                                   {"}", ""}};
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = std::string(descriptor_->name());
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = absl::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class ${$$classname$$}$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Annotate("{", "}", descriptor_);
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  absl::flat_hash_map<absl::string_view, std::string> vars = {{"{", ""},
                                                              {"}", ""}};
  for (auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = absl::StrCat((oneof)->index());
    if (context_->options().opensource_runtime) {
      // oneofCase_ and oneof_
      printer->Print(vars,
                     "private int $oneof_name$Case_ = 0;\n"
                     "private java.lang.Object $oneof_name$_;\n");
    }
    // OneofCase enum
    printer->Print(vars, "public enum ${$$oneof_capitalized_name$Case$}$ {\n");
    printer->Annotate("{", "}", oneof);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     absl::AsciiStrToUpper(field->name()), "field_number",
                     absl::StrCat(field->number()));
      printer->Annotate("field_name", field);
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          vars,
          "/**\n"
          " * @deprecated Use {@link #forNumber(int)} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
          "  return forNumber(value);\n"
          "}\n"
          "\n");
    }
    if (!context_->options().opensource_runtime) {
      printer->Print(
          "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    }
    printer->Print(
        vars,
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", absl::StrCat(field->number()),
                     "field_name", absl::AsciiStrToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO: Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "${$get$oneof_capitalized_name$Case$}$() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n");
    printer->Annotate("{", "}", oneof);
    printer->Print(vars,
                   "\n"
                   "private void ${$clear$oneof_capitalized_name$$}$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
    printer->Annotate("{", "}", oneof);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", absl::StrCat(descriptor_->field(i)->number()));
    printer->Annotate("constant_name", descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"ThrowNull\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "// SET_MEMOIZED_IS_INITIALIZED is never called for this message.\n"
        "// So it can do anything. Combine with default case for smaller "
        "codegen.\n"
        "case SET_MEMOIZED_IS_INITIALIZED:\n");
  }

  printer->Outdent();
  printer->Print(
      "}\n"
      "// Should never happen. Generates tight code to throw an exception.\n"
      "throw null;\n");
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}